

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::BoolLiteral::BoolLiteral
          (BoolLiteral *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  VariableType *type;
  int ndx;
  long lVar4;
  uint max;
  uint min;
  ConstStridedValueAccess<1> CVar5;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  int local_50;
  VariableType *local_48;
  pointer pMStack_40;
  pointer local_38;
  pointer pMStack_30;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__BoolLiteral_00c45950;
  type = VariableType::getScalarType(TYPE_BOOL);
  ValueStorage<64>::ValueStorage(&this->m_value,type);
  local_78._8_8_ = &local_60;
  local_78._0_8_ = (VariableType *)0x3;
  local_78._16_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = 1;
  local_48 = (VariableType *)0x0;
  pMStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pMStack_30 = (pointer)0x0;
  bVar2 = VariableType::operator==(valueRange.m_type,(VariableType *)local_78);
  VariableType::~VariableType((VariableType *)local_78);
  if (bVar2) {
    local_78._0_8_ = valueRange.m_type;
    local_78._8_8_ = valueRange.m_min;
    CVar5 = ConstStridedValueAccess<1>::component((ConstStridedValueAccess<1> *)local_78,0);
    min = (uint)(CVar5.m_value)->boolVal;
    local_78._0_8_ = valueRange.m_type;
    local_78._8_8_ = valueRange.m_max;
    CVar5 = ConstStridedValueAccess<1>::component((ConstStridedValueAccess<1> *)local_78,0);
    max = (uint)(CVar5.m_value)->boolVal;
  }
  else {
    max = 1;
    min = 0;
  }
  iVar3 = de::Random::getInt(state->m_random,min,max);
  VariableType::getScalarType(TYPE_BOOL);
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
    pSVar1[lVar4].boolVal = iVar3 == 1;
  }
  return;
}

Assistant:

BoolLiteral::BoolLiteral (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_value(VariableType::getScalarType(VariableType::TYPE_BOOL))
{
	int minVal = 0;
	int maxVal = 1;

	if (valueRange.getType() == VariableType(VariableType::TYPE_BOOL, 1))
	{
		minVal = valueRange.getMin().component(0).asBool() ? 1 : 0;
		maxVal = valueRange.getMax().component(0).asBool() ? 1 : 0;
	}

	bool			value	= state.getRandom().getInt(minVal, maxVal) == 1;
	ExecValueAccess	access	= m_value.getValue(VariableType::getScalarType(VariableType::TYPE_BOOL));

	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		access.asBool(ndx) = value;
}